

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O0

int Ssw_SecSpecial(Aig_Man_t *pPart0,Aig_Man_t *pPart1,int nFrames,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  abctime aVar6;
  abctime aVar7;
  abctime clkTotal;
  Aig_Man_t *pAStack_30;
  int RetValue;
  Aig_Man_t *pMiterCec;
  int nOuts;
  int iOut;
  int fVerbose_local;
  int nFrames_local;
  Aig_Man_t *pPart1_local;
  Aig_Man_t *pPart0_local;
  
  nOuts = fVerbose;
  iOut = nFrames;
  _fVerbose_local = pPart1;
  pPart1_local = pPart0;
  aVar6 = Abc_Clock();
  if (nOuts != 0) {
    Aig_ManPrintStats(pPart1_local);
    Aig_ManPrintStats(_fVerbose_local);
  }
  pAStack_30 = Saig_ManCreateMiterTwo(pPart1_local,_fVerbose_local,iOut);
  if (nOuts != 0) {
    Aig_ManPrintStats(pAStack_30);
  }
  iVar2 = Fra_FraigCec(&stack0xffffffffffffffd0,100000,nOuts);
  if (iVar2 == 1) {
    printf("Networks are equivalent.   ");
    Abc_Print(1,"%s =","Time");
    aVar7 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar7 - aVar6) * 1.0) / 1000000.0);
  }
  else if (iVar2 == 0) {
    printf("Networks are NOT EQUIVALENT.   ");
    Abc_Print(1,"%s =","Time");
    aVar7 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar7 - aVar6) * 1.0) / 1000000.0);
    if (pAStack_30->pData == (void *)0x0) {
      printf("Counter-example is not available.\n");
    }
    else {
      iVar3 = Ssw_SecCexResimulate(pAStack_30,(int *)pAStack_30->pData,(int *)&pMiterCec);
      pMiterCec._4_4_ = iVar3;
      if (iVar3 == -1) {
        printf("Counter-example verification has failed.\n");
      }
      else {
        iVar4 = Saig_ManPoNum(pPart1_local);
        iVar1 = pMiterCec._4_4_;
        if (iVar3 < iVar4 * iOut) {
          iVar4 = Saig_ManPoNum(pPart1_local);
          iVar3 = pMiterCec._4_4_;
          iVar5 = Saig_ManPoNum(pPart1_local);
          printf("Primary output %d has failed in frame %d.\n",(ulong)(uint)(iVar1 % iVar4),
                 (long)iVar3 / (long)iVar5 & 0xffffffff);
        }
        else {
          iVar3 = Saig_ManPoNum(pPart1_local);
          printf("Flop input %d has failed in the last frame.\n",(ulong)(uint)(iVar1 - iVar3 * iOut)
                );
        }
        printf("The counter-example detected %d incorrect POs or flop inputs.\n",
               (ulong)(uint)pMiterCec);
      }
    }
  }
  else {
    printf("Networks are UNDECIDED.   ");
    Abc_Print(1,"%s =","Time");
    aVar7 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar7 - aVar6) * 1.0) / 1000000.0);
  }
  fflush(_stdout);
  Aig_ManStop(pAStack_30);
  return iVar2;
}

Assistant:

int Ssw_SecSpecial( Aig_Man_t * pPart0, Aig_Man_t * pPart1, int nFrames, int fVerbose )
{
//    extern int Fra_FraigCec( Aig_Man_t ** ppAig, int nConfLimit, int fVerbose );
    int iOut, nOuts;
    Aig_Man_t * pMiterCec;
    int RetValue;
    abctime clkTotal = Abc_Clock();
    if ( fVerbose )
    {
        Aig_ManPrintStats( pPart0 );
        Aig_ManPrintStats( pPart1 );
    }
//    Aig_ManDumpBlif( pPart0, "file0.blif", NULL, NULL );
//    Aig_ManDumpBlif( pPart1, "file1.blif", NULL, NULL );
//    assert( Aig_ManNodeNum(pPart0) <= Aig_ManNodeNum(pPart1) );
/*
    if ( Aig_ManNodeNum(pPart0) >= Aig_ManNodeNum(pPart1) )
    {
        printf( "Warning: The design after synthesis is smaller!\n" );
        printf( "This warning may indicate that the order of designs is changed.\n" );
        printf( "The solver expects the original design as first argument and\n" );
        printf( "the modified design as the second argument in \"absec\".\n" );
    }
*/
    // create two-level miter
    pMiterCec = Saig_ManCreateMiterTwo( pPart0, pPart1, nFrames );
    if ( fVerbose )
    {
        Aig_ManPrintStats( pMiterCec );
//        Aig_ManDumpBlif( pMiterCec, "miter01.blif", NULL, NULL );
//        printf( "The new miter is written into file \"%s\".\n", "miter01.blif" );
    }
    // run CEC on this miter
    RetValue = Fra_FraigCec( &pMiterCec, 100000, fVerbose );
    // transfer model if given
//    if ( pNtk2 == NULL )
//        pNtk1->pModel = pMiterCec->pData, pMiterCec->pData = NULL;
    // report the miter
    if ( RetValue == 1 )
    {
        printf( "Networks are equivalent.   " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    else if ( RetValue == 0 )
    {
        printf( "Networks are NOT EQUIVALENT.   " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
        if ( pMiterCec->pData == NULL )
            printf( "Counter-example is not available.\n" );
        else
        {
            iOut = Ssw_SecCexResimulate( pMiterCec, (int *)pMiterCec->pData, &nOuts );
            if ( iOut == -1 )
                printf( "Counter-example verification has failed.\n" );
            else 
            {
                if ( iOut < Saig_ManPoNum(pPart0) * nFrames )
                    printf( "Primary output %d has failed in frame %d.\n", 
                        iOut%Saig_ManPoNum(pPart0), iOut/Saig_ManPoNum(pPart0) );
                else
                    printf( "Flop input %d has failed in the last frame.\n", 
                        iOut - Saig_ManPoNum(pPart0) * nFrames );
                printf( "The counter-example detected %d incorrect POs or flop inputs.\n", nOuts );
            }
        }
    }
    else
    {
        printf( "Networks are UNDECIDED.   " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    fflush( stdout );
    Aig_ManStop( pMiterCec );
    return RetValue;
}